

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  _Bool _Var6;
  byte bVar7;
  CURLUcode CVar8;
  CURLcode CVar9;
  char *pcVar10;
  char *newurl_local;
  
  newurl_local = newurl;
  if (type == FOLLOW_REDIR) {
    lVar3 = (data->set).followlocation;
    lVar4 = (data->set).maxredirs;
    if (lVar3 < lVar4 || lVar4 == -1) {
      puVar1 = &(data->state).field_0x4e4;
      *puVar1 = *puVar1 | 2;
      (data->set).followlocation = lVar3 + 1;
      type = FOLLOW_REDIR;
      if (((data->set).field_0x87b & 8) != 0) {
        if (((data->change).field_0x20 & 2) != 0) {
          (*Curl_cfree)((data->change).referer);
          (data->change).referer = (char *)0x0;
          puVar1 = &(data->change).field_0x20;
          *puVar1 = *puVar1 & 0xfd;
        }
        pcVar10 = (*Curl_cstrdup)((data->change).url);
        (data->change).referer = pcVar10;
        if (pcVar10 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        puVar1 = &(data->change).field_0x20;
        *puVar1 = *puVar1 | 2;
      }
      goto LAB_003d35b9;
    }
    bVar5 = true;
    type = FOLLOW_FAKE;
  }
  else {
LAB_003d35b9:
    bVar5 = false;
  }
  _Var6 = Curl_is_absolute_url(newurl,(char *)0x0,0x28);
  CVar8 = curl_url_set((data->state).uh,CURLUPART_URL,newurl,(uint)(type == FOLLOW_FAKE) << 3);
  if (CVar8 == CURLUE_OK) {
    CVar8 = curl_url_get((data->state).uh,CURLUPART_URL,&newurl_local,0);
    if (CVar8 != CURLUE_OK) {
      CVar9 = Curl_uc_to_curlcode(CVar8);
      return CVar9;
    }
    if (type != FOLLOW_FAKE) {
      if (_Var6) {
        puVar1 = &(data->state).field_0x4e4;
        *puVar1 = *puVar1 & 0xef;
      }
      bVar7 = (data->change).field_0x20;
      if ((bVar7 & 1) != 0) {
        (*Curl_cfree)((data->change).url);
        bVar7 = (data->change).field_0x20;
      }
      (data->change).url = newurl_local;
      (data->change).field_0x20 = bVar7 | 1;
      Curl_infof(data,"Issue another request to this URL: \'%s\'\n");
      iVar2 = (data->info).httpcode;
      if (iVar2 == 0x12f) {
        if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
          (data->set).httpreq = HTTPREQ_GET;
          pcVar10 = "HEAD";
          if ((*(uint *)&(data->set).field_0x878 >> 0x1c & 1) == 0) {
            pcVar10 = "GET";
          }
          Curl_infof(data,"Disables POST, goes with %s\n",pcVar10);
        }
      }
      else {
        if (iVar2 == 0x12e) {
          if (2 < (data->set).httpreq - HTTPREQ_POST) goto LAB_003d3793;
          bVar7 = (byte)(data->set).keep_post & 2;
        }
        else {
          if ((iVar2 != 0x12d) || (2 < (data->set).httpreq - HTTPREQ_POST)) goto LAB_003d3793;
          bVar7 = (byte)(data->set).keep_post & 1;
        }
        if (bVar7 == 0) {
          Curl_infof(data,"Switch from POST to GET\n");
          (data->set).httpreq = HTTPREQ_GET;
        }
      }
LAB_003d3793:
      Curl_pgrsTime(data,TIMER_REDIRECT);
      Curl_pgrsResetTransferSizes(data);
      return CURLE_OK;
    }
  }
  else {
    if (type != FOLLOW_FAKE) {
      CVar9 = Curl_uc_to_curlcode(CVar8);
      return CVar9;
    }
    newurl_local = (*Curl_cstrdup)(newurl);
    if (newurl_local == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (data->info).wouldredirect = newurl_local;
  CVar9 = CURLE_OK;
  if (bVar5) {
    Curl_failf(data,"Maximum (%ld) redirects followed",(data->set).maxredirs);
    CVar9 = CURLE_TOO_MANY_REDIRECTS;
  }
  return CVar9;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;
  CURLUcode uc;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->set.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      /* mark the next request as a followed location: */
      data->state.this_is_a_follow = TRUE;

      data->set.followlocation++; /* count location-followers */

      if(data->set.http_auto_referer) {
        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->change.referer_alloc) {
          Curl_safefree(data->change.referer);
          data->change.referer_alloc = FALSE;
        }

        data->change.referer = strdup(data->change.url);
        if(!data->change.referer)
          return CURLE_OUT_OF_MEMORY;
        data->change.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if(Curl_is_absolute_url(newurl, NULL, MAX_SCHEME_LEN))
    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

  DEBUGASSERT(data->state.uh);
  uc = curl_url_set(data->state.uh, CURLUPART_URL, newurl,
                    (type == FOLLOW_FAKE) ? CURLU_NON_SUPPORT_SCHEME : 0);
  if(uc) {
    if(type != FOLLOW_FAKE)
      return Curl_uc_to_curlcode(uc);

    /* the URL could not be parsed for some reason, but since this is FAKE
       mode, just duplicate the field as-is */
    newurl = strdup(newurl);
    if(!newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else {

    uc = curl_url_get(data->state.uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc)
    Curl_safefree(data->change.url);

  data->change.url = newurl;
  data->change.url_alloc = TRUE;

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitly
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}